

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O2

DeviceType Diligent::RenderDeviceTypeToArchiveDeviceType(RENDER_DEVICE_TYPE Type)

{
  DeviceType DVar1;
  uint uVar2;
  string msg;
  
  uVar2 = Type - RENDER_DEVICE_TYPE_D3D11;
  if ((uVar2 < 7) && ((0x5fU >> (uVar2 & 0x1f) & 1) != 0)) {
    DVar1 = *(DeviceType *)(&DAT_006616e8 + (ulong)uVar2 * 4);
  }
  else {
    FormatString<char[23]>(&msg,(char (*) [23])"Unexpected device type");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"RenderDeviceTypeToArchiveDeviceType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x3d);
    std::__cxx11::string::~string((string *)&msg);
    DVar1 = Count;
  }
  return DVar1;
}

Assistant:

DeviceObjectArchive::DeviceType RenderDeviceTypeToArchiveDeviceType(RENDER_DEVICE_TYPE Type)
{
    static_assert(RENDER_DEVICE_TYPE_COUNT == 8, "Did you add a new render device type? Please handle it here.");
    switch (Type)
    {
            // clang-format off
        case RENDER_DEVICE_TYPE_D3D11:  return DeviceObjectArchive::DeviceType::Direct3D11;
        case RENDER_DEVICE_TYPE_D3D12:  return DeviceObjectArchive::DeviceType::Direct3D12;
        case RENDER_DEVICE_TYPE_GL:     return DeviceObjectArchive::DeviceType::OpenGL;
        case RENDER_DEVICE_TYPE_GLES:   return DeviceObjectArchive::DeviceType::OpenGL;
        case RENDER_DEVICE_TYPE_VULKAN: return DeviceObjectArchive::DeviceType::Vulkan;
#if PLATFORM_MACOS
        case RENDER_DEVICE_TYPE_METAL:  return DeviceObjectArchive::DeviceType::Metal_MacOS;
#elif PLATFORM_IOS || PLATFORM_TVOS
        case RENDER_DEVICE_TYPE_METAL:  return DeviceObjectArchive::DeviceType::Metal_iOS;
#endif
        case RENDER_DEVICE_TYPE_WEBGPU:
            return DeviceObjectArchive::DeviceType::WebGPU;

        // clang-format on
        default:
            UNEXPECTED("Unexpected device type");
            return DeviceObjectArchive::DeviceType::Count;
    }
}